

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_logging.h
# Opt level: O3

void oonf_log_updatemask(void)

{
  list_entity *plVar1;
  list_entity *plVar2;
  long lVar3;
  byte bVar4;
  
  builtin_memcpy(log_global_mask + 0x70,"\f\f\f\f\f\f\f\f\f\f\f\f\f\f\f\f",0x10);
  builtin_memcpy(log_global_mask + 0x60,"\f\f\f\f\f\f\f\f\f\f\f\f\f\f\f\f",0x10);
  builtin_memcpy(log_global_mask + 0x50,"\f\f\f\f\f\f\f\f\f\f\f\f\f\f\f\f",0x10);
  builtin_memcpy(log_global_mask + 0x40,"\f\f\f\f\f\f\f\f\f\f\f\f\f\f\f\f",0x10);
  builtin_memcpy(log_global_mask + 0x30,"\f\f\f\f\f\f\f\f\f\f\f\f\f\f\f\f",0x10);
  builtin_memcpy(log_global_mask + 0x20,"\f\f\f\f\f\f\f\f\f\f\f\f\f\f\f\f",0x10);
  builtin_memcpy(log_global_mask + 0x10,"\f\f\f\f\f\f\f\f\f\f\f\f\f\f\f\f",0x10);
  builtin_memcpy(log_global_mask,"\f\f\f\f\f\f\f\f\f\f\f\f\f\f\f\f",0x10);
  plVar2 = _handler_list.next;
  if ((_handler_list.next)->prev != _handler_list.prev) {
    do {
      plVar1 = plVar2->next;
      lVar3 = 0;
      do {
        bVar4 = *(byte *)&plVar2[1].prev | *(byte *)((long)&plVar2[1].prev + lVar3);
        bVar4 = bVar4 * '\x02' | bVar4;
        bVar4 = bVar4 * '\x04' | bVar4;
        *(byte *)((long)&plVar2[9].prev + lVar3) = bVar4;
        log_global_mask[lVar3] = log_global_mask[lVar3] | bVar4;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x80);
      plVar2 = plVar1;
    } while (plVar1->prev != _handler_list.prev);
  }
  return;
}

Assistant:

static INLINE void
oonf_log_mask_clear(uint8_t *mask) {
  memset(mask, LOG_SEVERITY_WARN | LOG_SEVERITY_ASSERT, LOG_MAXIMUM_SOURCES);
}